

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

int singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  GCObject *o;
  byte bVar1;
  int iVar2;
  TString **ppTVar3;
  ulong uVar4;
  ulong uVar5;
  BlockCnt *pBVar6;
  long lVar7;
  
  if (fs == (FuncState *)0x0) {
    var->t = -1;
    var->f = -1;
    var->k = VGLOBAL;
    (var->u).s.info = 0xff;
LAB_00110f58:
    iVar2 = 8;
  }
  else {
    uVar5 = (ulong)fs->nactvar;
    do {
      uVar4 = uVar5;
      if ((long)uVar4 < 1) {
        iVar2 = singlevaraux(fs->prev,n,var,0);
        if (iVar2 == 8) goto LAB_00110f58;
        o = (GCObject *)fs->f;
        iVar2 = (o->p).sizeupvalues;
        lVar7 = (long)iVar2;
        bVar1 = (o->p).nups;
        uVar5 = 0;
        goto LAB_00110f77;
      }
      uVar5 = uVar4 - 1;
    } while (fs->f->locvars[*(ushort *)&fs->upvalues[uVar4 + 0x3b].info].varname != n);
    var->t = -1;
    var->f = -1;
    var->k = VLOCAL;
    (var->u).s.info = (int)(uVar4 - 1);
    iVar2 = 6;
    if (base == 0) {
      pBVar6 = (BlockCnt *)&fs->bl;
      do {
        pBVar6 = pBVar6->previous;
        if (pBVar6 == (BlockCnt *)0x0) {
          return 6;
        }
      } while ((long)uVar4 <= (long)(ulong)pBVar6->nactvar);
      pBVar6->upval = '\x01';
    }
  }
  return iVar2;
LAB_00110f77:
  if (bVar1 == uVar5) {
    if (0x3b < bVar1) {
      errorlimit(fs,0x3c,"upvalues");
      bVar1 = (o->p).nups;
      iVar2 = (o->p).sizeupvalues;
    }
    if (iVar2 <= (int)(uint)bVar1) {
      ppTVar3 = (TString **)
                luaM_growaux_(fs->L,(o->p).upvalues,&(o->p).sizeupvalues,8,0x7ffffffd,"");
      (o->p).upvalues = ppTVar3;
      iVar2 = (o->p).sizeupvalues;
    }
    for (; lVar7 < iVar2; lVar7 = lVar7 + 1) {
      (o->p).upvalues[lVar7] = (TString *)0x0;
    }
    bVar1 = (o->p).nups;
    uVar5 = (ulong)bVar1;
    (o->p).upvalues[uVar5] = n;
    if ((((n->tsv).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
      luaC_barrierf(fs->L,o,(GCObject *)n);
      bVar1 = (o->p).nups;
      uVar5 = (ulong)bVar1;
    }
    fs->upvalues[uVar5].k = (char)var->k;
    fs->upvalues[uVar5].info = *(lu_byte *)&var->u;
    (o->p).nups = bVar1 + 1;
    uVar5 = (ulong)bVar1;
LAB_0011104f:
    (var->u).s.info = (int)uVar5;
    var->k = VUPVAL;
    return 7;
  }
  if ((var->k == (uint)fs->upvalues[uVar5].k) && ((var->u).s.info == (uint)fs->upvalues[uVar5].info)
     ) goto LAB_0011104f;
  uVar5 = uVar5 + 1;
  goto LAB_00110f77;
}

Assistant:

static int singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL) {  /* no more levels? */
    init_exp(var, VGLOBAL, NO_REG);  /* default is global variable */
    return VGLOBAL;
  }
  else {
    int v = searchvar(fs, n);  /* look up at current level */
    if (v >= 0) {
      init_exp(var, VLOCAL, v);
      if (!base)
        markupval(fs, v);  /* local will be used as an upval */
      return VLOCAL;
    }
    else {  /* not found at current level; try upper one */
      if (singlevaraux(fs->prev, n, var, 0) == VGLOBAL)
        return VGLOBAL;
      var->u.s.info = indexupvalue(fs, n, var);  /* else was LOCAL or UPVAL */
      var->k = VUPVAL;  /* upvalue in this level */
      return VUPVAL;
    }
  }
}